

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinput.cc
# Opt level: O2

void __thiscall
ImageInput::readScanline
          (ImageInput *this,void *pBufferOut,size_t bufferByteCount,uint32_t y,uint32_t z,
          uint32_t subimage,uint32_t miplevel,FormatDescriptor *format)

{
  ulong uVar1;
  long lVar2;
  pointer puVar3;
  unsigned_short *read;
  uchar *read_00;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 extraout_var;
  long lVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  runtime_error *prVar11;
  buffer_too_small *this_00;
  uint uVar12;
  size_t nvals;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar13;
  pointer puVar14;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_a8;
  string local_88;
  char *local_68;
  char *local_58;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  undefined4 extraout_var_00;
  undefined4 extraout_var_03;
  
  aVar13._4_4_ = in_register_0000008c;
  aVar13._0_4_ = subimage;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    format = (FormatDescriptor *)CONCAT44(extraout_var,iVar4);
  }
  uVar5 = FormatDescriptor::largestChannelBitLength(format);
  uVar6 = imageio::bit_ceil<unsigned_int>(uVar5);
  uVar12 = 8;
  if (8 < uVar6) {
    uVar12 = uVar6;
  }
  if ((uVar12 != 8) && (uVar12 != 0x10)) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8._M_dataplus._M_p = (pointer)(ulong)uVar12;
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x35;
    args_00.field_1.args_ = aVar13.args_;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_88,(v10 *)0x17b0fb,fmt_00,args_00);
    std::runtime_error::runtime_error(prVar11,(string *)&local_88);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = *(ulong *)(format->samples).
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)uVar1;
  if ((uVar1 & 0xf0000000) != 0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88.field_2._M_allocated_capacity = (size_type)" Linear";
    if ((uVar6 >> 0x1c & 1) == 0) {
      local_88.field_2._M_allocated_capacity = (size_type)"";
    }
    local_68 = " Exponent";
    if ((uVar6 >> 0x1d & 1) == 0) {
      local_68 = "";
    }
    local_58 = " Signed";
    if ((uVar6 >> 0x1e & 1) == 0) {
      local_58 = "";
    }
    local_88._M_dataplus._M_p = (pointer)(ulong)uVar12;
    local_48.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x177700;
    if (-1 < (int)uVar6) {
      local_48.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x1784a0;
    }
    fmt.size_ = 0xcccc2;
    fmt.data_ = (char *)0x3f;
    args.field_1.values_ = local_48.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)0x1791e4,fmt,args);
    std::runtime_error::runtime_error(prVar11,(string *)&local_a8);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (*this->_vptr_ImageInput[0x16])(this,(ulong)subimage,(ulong)miplevel);
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  lVar9 = CONCAT44(extraout_var_00,iVar4);
  if ((ulong)*(uint *)(lVar9 + 0x10) * (ulong)uVar12 *
      (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) * *(int *)(lVar9 + 0x74)) >> 3 <
      bufferByteCount) {
    this_00 = (buffer_too_small *)__cxa_allocate_exception(0x10);
    buffer_too_small::buffer_too_small(this_00);
    __cxa_throw(this_00,&buffer_too_small::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = FormatDescriptor::channelBitLength(format);
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  uVar7 = FormatDescriptor::channelBitLength((FormatDescriptor *)CONCAT44(extraout_var_01,iVar4));
  puVar14 = (pointer)pBufferOut;
  if (uVar5 != uVar7) {
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    uVar5 = FormatDescriptor::channelBitLength((FormatDescriptor *)CONCAT44(extraout_var_02,iVar4));
    if (uVar5 == 0x10) {
      lVar9 = *(long *)&this->field_0x268;
      lVar2 = *(long *)&this->nativeBuffer16;
      iVar4 = (*this->_vptr_ImageInput[0xe])(this);
      lVar10 = CONCAT44(extraout_var_03,iVar4);
      if ((ulong)(lVar9 - lVar2 >> 1) <
          (ulong)*(uint *)(lVar10 + 0x10) *
          (ulong)(uint)(*(int *)(lVar10 + 0x70) * *(int *)(lVar10 + 0x78) * *(int *)(lVar10 + 0x74))
         ) {
        iVar4 = (*this->_vptr_ImageInput[0xe])(this);
        lVar9 = CONCAT44(extraout_var_04,iVar4);
        Imageio::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&this->nativeBuffer16,
                   (ulong)*(uint *)(lVar9 + 0x10) *
                   (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) *
                                *(int *)(lVar9 + 0x74)));
      }
      puVar14 = *(pointer *)&this->nativeBuffer16;
      bufferByteCount = *(long *)&this->field_0x268 - (long)puVar14;
    }
    else {
      puVar14 = (this->nativeBuffer8).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar3 = (this->nativeBuffer8).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = (*this->_vptr_ImageInput[0xe])(this);
      lVar9 = CONCAT44(extraout_var_05,iVar4);
      if ((ulong)((long)puVar14 - (long)puVar3) <
          (ulong)*(uint *)(lVar9 + 0x10) *
          (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) * *(int *)(lVar9 + 0x74))) {
        iVar4 = (*this->_vptr_ImageInput[0xe])(this);
        lVar9 = CONCAT44(extraout_var_06,iVar4);
        Imageio::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->nativeBuffer8,
                   (ulong)*(uint *)(lVar9 + 0x10) *
                   (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) *
                                *(int *)(lVar9 + 0x74)));
      }
      puVar14 = (this->nativeBuffer8).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      bufferByteCount = *(long *)&this->field_0x268 - *(long *)&this->nativeBuffer16 >> 1;
    }
  }
  (*this->_vptr_ImageInput[0x19])
            (this,puVar14,bufferByteCount,(ulong)y,(ulong)z,(ulong)subimage,miplevel);
  if (puVar14 == *(pointer *)&this->nativeBuffer16) {
    uVar5 = FormatDescriptor::channelUpper(format);
    read = *(unsigned_short **)&this->nativeBuffer16;
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    uVar7 = FormatDescriptor::channelUpper((FormatDescriptor *)CONCAT44(extraout_var_08,iVar4));
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    lVar9 = CONCAT44(extraout_var_09,iVar4);
    rescale<unsigned_short,unsigned_char>
              ((uchar *)pBufferOut,(uchar)uVar5,read,(unsigned_short)uVar7,
               (ulong)*(uint *)(lVar9 + 0x10) *
               (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) *
                            *(int *)(lVar9 + 0x74)));
    return;
  }
  puVar3 = (this->nativeBuffer8).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = FormatDescriptor::channelUpper(format);
  if (puVar14 == puVar3) {
    read_00 = (this->nativeBuffer8).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    uVar7 = FormatDescriptor::channelUpper((FormatDescriptor *)CONCAT44(extraout_var_10,iVar4));
    iVar4 = (*this->_vptr_ImageInput[0xe])(this);
    lVar9 = CONCAT44(extraout_var_11,iVar4);
    rescale<unsigned_char,unsigned_short>
              ((unsigned_short *)pBufferOut,(unsigned_short)uVar5,read_00,(uchar)uVar7,
               (ulong)*(uint *)(lVar9 + 0x10) *
               (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) *
                            *(int *)(lVar9 + 0x74)));
    return;
  }
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  uVar7 = FormatDescriptor::channelUpper((FormatDescriptor *)CONCAT44(extraout_var_07,iVar4));
  if (uVar5 == uVar7) {
    return;
  }
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  uVar5 = FormatDescriptor::channelBitLength((FormatDescriptor *)CONCAT44(extraout_var_12,iVar4));
  uVar7 = FormatDescriptor::channelUpper(format);
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  uVar8 = FormatDescriptor::channelUpper((FormatDescriptor *)CONCAT44(extraout_var_13,iVar4));
  iVar4 = (*this->_vptr_ImageInput[0xe])(this);
  lVar9 = CONCAT44(extraout_var_14,iVar4);
  nvals = (ulong)*(uint *)(lVar9 + 0x10) *
          (ulong)(uint)(*(int *)(lVar9 + 0x70) * *(int *)(lVar9 + 0x78) * *(int *)(lVar9 + 0x74));
  if (uVar5 == 0x10) {
    rescale<unsigned_short,unsigned_short>
              ((unsigned_short *)pBufferOut,(unsigned_short)uVar7,(unsigned_short *)pBufferOut,
               (unsigned_short)uVar8,nvals);
    return;
  }
  rescale<unsigned_char,unsigned_char>
            ((uchar *)pBufferOut,(uchar)uVar7,(uchar *)pBufferOut,(uchar)uVar8,nvals);
  return;
}

Assistant:

void
ImageInput::readScanline(void* pBufferOut, size_t bufferByteCount,
                         uint32_t y, uint32_t z,
                         uint32_t subimage, uint32_t miplevel,
                         const FormatDescriptor& format)
{
    const auto& targetFormat = format.isUnknown() ? spec().format() : format;

    const auto targetBitLength = targetFormat.largestChannelBitLength();
    const auto requestBits = std::max(imageio::bit_ceil(targetBitLength), 8u);

    if (requestBits != 8 && requestBits != 16)
        throw std::runtime_error(fmt::format(
                "Requested decode into {}-bit format is not supported.",
                requestBits)
              );

    const bool targetL = targetFormat.samples[0].qualifierLinear;
    const bool targetE = targetFormat.samples[0].qualifierExponent;
    const bool targetS = targetFormat.samples[0].qualifierSigned;
    const bool targetF = targetFormat.samples[0].qualifierFloat;

    // Only UNORM requests are supported here.
    if (targetE || targetL || targetS || targetF)
        throw std::runtime_error(fmt::format(
                "Requested format conversion to {}-bit{}{}{}{} is not supported.",
                requestBits,
                targetL ? " Linear" : "",
                targetE ? " Exponent" : "",
                targetS ? " Signed" : "",
                targetF ? " Float" : "")
              );

    seekSubimage(subimage, miplevel);

    size_t imageByteCount = (requestBits * spec().imageChannelCount()) / 8;
    if (imageByteCount < bufferByteCount)
        throw buffer_too_small();

    uint8_t* pNativeBuffer;
    if (targetFormat.channelBitLength() != spec().format().channelBitLength()) {
        if (spec().format().channelBitLength() == 16) {
            if (nativeBuffer16.size() < spec().imageChannelCount())
                nativeBuffer16.resize(spec().imageChannelCount());
            pNativeBuffer = reinterpret_cast<uint8_t*>(nativeBuffer16.data());
            bufferByteCount = nativeBuffer16.size() * sizeof(uint16_t);
        } else {
            if (nativeBuffer8.size() < spec().imageChannelCount())
                nativeBuffer8.resize(spec().imageChannelCount());
            pNativeBuffer = nativeBuffer8.data();
            bufferByteCount = nativeBuffer16.size() * sizeof(uint8_t);
        }
    } else {
        pNativeBuffer = static_cast<uint8_t*>(pBufferOut);
    }

    readNativeScanline(pNativeBuffer, bufferByteCount, y, z, subimage, miplevel);

    if (reinterpret_cast<uint16_t*>(pNativeBuffer) == nativeBuffer16.data()) {
         rescale(static_cast<uint8_t*>(pBufferOut),
                 static_cast<uint8_t>(targetFormat.channelUpper()),
                 nativeBuffer16.data(),
                 static_cast<uint16_t>(spec().format().channelUpper()),
                 spec().imageChannelCount());
    } else if (pNativeBuffer == nativeBuffer8.data()) {
         rescale(static_cast<uint16_t*>(pBufferOut),
                 static_cast<uint16_t>(targetFormat.channelUpper()),
                 nativeBuffer8.data(),
                 static_cast<uint8_t>(spec().format().channelUpper()),
                 spec().imageChannelCount());
    } else if (targetFormat.channelUpper() != spec().format().channelUpper()) {
        if (spec().format().channelBitLength() == 16) {
            rescale(static_cast<uint16_t*>(pBufferOut),
                    static_cast<uint16_t>(targetFormat.channelUpper()),
                    static_cast<uint16_t*>(pBufferOut),
                    static_cast<uint16_t>(spec().format().channelUpper()),
                    spec().imageChannelCount());
        } else {
            rescale(static_cast<uint8_t*>(pBufferOut),
                    static_cast<uint8_t>(targetFormat.channelUpper()),
                    static_cast<uint8_t*>(pBufferOut),
                    static_cast<uint8_t>(spec().format().channelUpper()),
                    spec().imageChannelCount());
        }
    }
}